

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_namer.h
# Opt level: O0

string * __thiscall
flatbuffers::IdlNamer::LegacyRustNativeVariant_abi_cxx11_
          (string *__return_storage_ptr__,IdlNamer *this,EnumVal *v)

{
  string local_40;
  EnumVal *local_20;
  EnumVal *v_local;
  IdlNamer *this_local;
  
  local_20 = v;
  v_local = (EnumVal *)this;
  this_local = (IdlNamer *)__return_storage_ptr__;
  (*(this->super_Namer)._vptr_Namer[0xe])(&local_40,this,v);
  ConvertCase(__return_storage_ptr__,&local_40,kUpperCamel,kSnake);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string LegacyRustNativeVariant(const EnumVal &v) const {
    return ConvertCase(EscapeKeyword(v.name), Case::kUpperCamel);
  }